

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O3

Var Js::JavascriptPromise::TriggerPromiseReactions
              (JavascriptPromiseReactionList *reactions,bool isRejecting,Var resolution,
              ScriptContext *scriptContext)

{
  JavascriptLibrary *pJVar1;
  JavascriptPromiseReactionList *pJVar2;
  code *pcVar3;
  SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *pSVar4;
  bool bVar5;
  undefined4 *puVar6;
  Type *pTVar7;
  Iterator local_48;
  Type local_38;
  
  pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  if (reactions != (JavascriptPromiseReactionList *)0x0) {
    local_48.list =
         &reactions->super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>
    ;
    local_48.current = (NodeBase *)reactions;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    while( true ) {
      if (reactions == (JavascriptPromiseReactionList *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
        reactions = (JavascriptPromiseReactionList *)local_48.current;
      }
      pSVar4 = local_48.list;
      pJVar2 = (JavascriptPromiseReactionList *)
               (reactions->
               super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>).
               super_SListNodeBase<Memory::Recycler>.next.ptr;
      Memory::Recycler::WBSetBit((char *)&local_38);
      local_38.ptr = (SListNodeBase<Memory::Recycler> *)pJVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
      if ((SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)local_38.ptr
          == pSVar4) break;
      pJVar2 = (JavascriptPromiseReactionList *)
               (((SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                &(local_48.current)->next)->super_SListNodeBase<Memory::Recycler>).next.ptr;
      Memory::Recycler::WBSetBit((char *)&local_38);
      local_38.ptr = (SListNodeBase<Memory::Recycler> *)pJVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
      local_48.current = local_38.ptr;
      pTVar7 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Iterator::
               Data(&local_48);
      EnqueuePromiseReactionTask((&pTVar7->resolveReaction)[isRejecting],resolution,scriptContext);
      reactions = (JavascriptPromiseReactionList *)local_48.current;
    }
  }
  return (pJVar1->super_JavascriptLibraryBase).undefinedValue.ptr;
}

Assistant:

Var JavascriptPromise::TriggerPromiseReactions(JavascriptPromiseReactionList* reactions, bool isRejecting, Var resolution, ScriptContext* scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();

        if (reactions != nullptr)
        {
            JavascriptPromiseReactionList::Iterator it = reactions->GetIterator();
            while (it.Next())
            {
                JavascriptPromiseReaction* reaction;
                if (isRejecting)
                {
                    reaction = it.Data().rejectReaction;
                }
                else
                {
                    reaction = it.Data().resolveReaction;
                }

                EnqueuePromiseReactionTask(reaction, resolution, scriptContext);
            }
        }

        return library->GetUndefined();
    }